

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

ObjWriteGuardBucket
BackwardPass::MergeWriteGuards(ObjWriteGuardBucket bucket1,ObjWriteGuardBucket bucket2)

{
  code *pcVar1;
  bool bVar2;
  BVSparse<Memory::JitArenaAllocator> *this;
  undefined4 *puVar3;
  ObjWriteGuardBucket OVar4;
  
  if (bucket1.writeGuards == (BVSparse<Memory::JitArenaAllocator> *)0x0 &&
      bucket2.writeGuards == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                       ,0x4ec,"(writeGuards1 || writeGuards2)","writeGuards1 || writeGuards2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  else if (bucket1.writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    this = BVSparse<Memory::JitArenaAllocator>::CopyNew(bucket1.writeGuards);
    if (bucket2.writeGuards != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this,bucket2.writeGuards);
    }
    return (ObjWriteGuardBucket)this;
  }
  OVar4.writeGuards = BVSparse<Memory::JitArenaAllocator>::CopyNew(bucket2.writeGuards);
  return (ObjWriteGuardBucket)OVar4.writeGuards;
}

Assistant:

ObjWriteGuardBucket
BackwardPass::MergeWriteGuards(ObjWriteGuardBucket bucket1, ObjWriteGuardBucket bucket2)
{
    BVSparse<JitArenaAllocator> *writeGuards1 = bucket1.GetWriteGuards();
    BVSparse<JitArenaAllocator> *writeGuards2 = bucket2.GetWriteGuards();
    Assert(writeGuards1 || writeGuards2);

    BVSparse<JitArenaAllocator> *mergedWriteGuards;
    if (writeGuards1)
    {
        mergedWriteGuards = writeGuards1->CopyNew();
        if (writeGuards2)
        {
            mergedWriteGuards->Or(writeGuards2);
        }
    }
    else
    {
        mergedWriteGuards = writeGuards2->CopyNew();
    }

    ObjWriteGuardBucket bucket;
    bucket.SetWriteGuards(mergedWriteGuards);
    return bucket;
}